

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O2

Vec_Int_t * Gia_ManSwiSimulate(Gia_Man_t *pAig,Gia_ParSwi_t *pPars)

{
  Gia_Man_t *pGVar1;
  uint *puVar2;
  uint *puVar3;
  int *piVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  abctime aVar14;
  abctime aVar15;
  Gia_ManSwi_t *p;
  abctime aVar16;
  Gia_Obj_t *pGVar17;
  Vec_Int_t *pVVar18;
  long lVar19;
  int i;
  int iVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  bool bVar30;
  float fVar31;
  double dVar32;
  
  aVar14 = Abc_Clock();
  if ((pPars->fProbOne != 0) && (pPars->fProbTrans != 0)) {
    puts(
        "Conflict of options: Can either compute probability of 1, or probability of switching by observing transitions."
        );
  }
  aVar15 = Abc_Clock();
  p = Gia_ManSwiCreate(pAig,pPars);
  if (pPars->fVerbose != 0) {
    iVar20 = pAig->vCis->nSize;
    pGVar1 = p->pAig;
    printf("Obj = %8d (%8d). F = %6d. ",(ulong)(uint)pAig->nObjs,
           (ulong)(uint)(iVar20 + pAig->nObjs + ~(pAig->vCos->nSize + iVar20)),
           (ulong)(uint)pGVar1->nFront);
    dVar32 = (double)p->nWords * 4.0;
    iVar20 = 0x76478f;
    printf("AIG = %7.2f MB. F-mem = %7.2f MB. Other = %7.2f MB.  ",
           (double)pGVar1->nObjs * 12.0 * 9.5367431640625e-07,
           (double)pGVar1->nFront * dVar32 * 9.5367431640625e-07,
           (double)(pGVar1->vCos->nSize + pGVar1->vCis->nSize) * dVar32 * 9.5367431640625e-07);
    Abc_Print(iVar20,"%s =","Time");
    aVar16 = Abc_Clock();
    Abc_Print(iVar20,"%9.2f sec\n",(double)(aVar16 - aVar15) / 1000000.0);
  }
  Gia_ManRandom(1);
  pGVar1 = p->pAig;
  for (iVar20 = 0; iVar13 = pGVar1->vCis->nSize, iVar20 < iVar13 - pGVar1->nRegs;
      iVar20 = iVar20 + 1) {
    Gia_ManSwiSimInfoRandom(p,p->pDataSimCis + (long)iVar20 * (long)p->nWords,0);
  }
  for (; iVar20 < iVar13; iVar20 = iVar20 + 1) {
    Gia_ManSwiSimInfoZero(p,p->pDataSimCis + (long)iVar20 * (long)p->nWords);
    iVar13 = pGVar1->vCis->nSize;
  }
  for (iVar20 = 0; uVar6 = pPars->nIters, iVar20 < (int)uVar6; iVar20 = iVar20 + 1) {
    if (pGVar1->nFront < 1) {
      __assert_fail("p->pAig->nFront > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                    ,0x1dd,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
    }
    if (pGVar1->pObjs->Value != 0) {
      __assert_fail("Gia_ManConst0(p->pAig)->Value == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                    ,0x1de,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
    }
    iVar13 = pPars->nPref;
    puVar2 = p->pDataSim;
    Gia_ManSwiSimInfoZero(p,puVar2);
    lVar27 = 1;
    while ((lVar27 < pGVar1->nObjs &&
           (pGVar17 = Gia_ManObj(pGVar1,(int)lVar27), pGVar17 != (Gia_Obj_t *)0x0))) {
      uVar23 = *(ulong *)pGVar17;
      uVar6 = (uint)uVar23;
      if ((int)uVar6 < 0) {
        if ((~uVar6 & 0x1fffffff) == 0) {
          if (pGVar1->nFront <= (int)pGVar17->Value) {
            __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                          ,0x1ef,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
          }
          iVar21 = Gia_ObjCioId(pGVar17);
          uVar6 = p->nWords;
          uVar8 = pGVar17->Value;
          puVar3 = p->pDataSimCis;
          uVar29 = (ulong)uVar6;
          for (uVar23 = uVar29; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
            puVar2[(long)(int)(uVar8 * uVar6) + (uVar23 - 1)] =
                 puVar3[(long)(int)(iVar21 * uVar6) + (uVar23 - 1)];
          }
        }
        else {
          if (pGVar17->Value != 0x1fffffff) {
            __assert_fail("Gia_ObjValue(pObj) == GIA_NONE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                          ,0x1e9,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
          }
          iVar21 = Gia_ObjCioId(pGVar17);
          puVar3 = p->pDataSimCos;
          uVar6 = p->nWords;
          uVar29 = (ulong)uVar6;
          lVar19 = (long)(int)((*(uint *)pGVar17 & 0x1fffffff) * uVar6);
          uVar23 = uVar29;
          if ((*(uint *)pGVar17 >> 0x1d & 1) == 0) {
            for (; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
              puVar3[(long)(int)(iVar21 * uVar6) + (uVar23 - 1)] = puVar2[lVar19 + (uVar23 - 1)];
            }
          }
          else {
            for (; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
              puVar3[(long)(int)(iVar21 * uVar6) + (uVar23 - 1)] = ~puVar2[lVar19 + (uVar23 - 1)];
            }
          }
        }
      }
      else {
        if (pGVar1->nFront <= (int)pGVar17->Value) {
          __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                        ,0x1e4,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
        }
        uVar8 = p->nWords;
        uVar29 = (ulong)uVar8;
        lVar22 = (long)(int)(pGVar17->Value * uVar8);
        lVar19 = (long)(int)((uVar6 & 0x1fffffff) * uVar8);
        lVar24 = (long)(int)(((uint)(uVar23 >> 0x20) & 0x1fffffff) * uVar8);
        if ((uVar6 >> 0x1d & 1) == 0) {
          uVar25 = uVar29;
          if ((uVar23 >> 0x3d & 1) == 0) {
            for (; 0 < (int)uVar25; uVar25 = uVar25 - 1) {
              puVar2[lVar22 + (uVar25 - 1)] =
                   puVar2[lVar24 + (uVar25 - 1)] & puVar2[lVar19 + (uVar25 - 1)];
            }
          }
          else {
            for (; 0 < (int)uVar25; uVar25 = uVar25 - 1) {
              puVar2[lVar22 + (uVar25 - 1)] =
                   ~puVar2[lVar24 + (uVar25 - 1)] & puVar2[lVar19 + (uVar25 - 1)];
            }
          }
        }
        else {
          uVar25 = uVar29;
          if ((uVar23 >> 0x3d & 1) == 0) {
            for (; 0 < (int)uVar25; uVar25 = uVar25 - 1) {
              puVar2[lVar22 + (uVar25 - 1)] =
                   ~puVar2[lVar19 + (uVar25 - 1)] & puVar2[lVar24 + (uVar25 - 1)];
            }
          }
          else {
            for (lVar26 = 0; 0 < (int)(uVar8 + (int)lVar26); lVar26 = lVar26 + -1) {
              puVar2[lVar22 + uVar29 + lVar26 + -1] =
                   ~(puVar2[lVar24 + uVar29 + lVar26 + -1] | puVar2[lVar19 + uVar29 + lVar26 + -1]);
            }
          }
        }
      }
      if ((iVar13 <= iVar20) &&
         (-1 < (int)*(uint *)pGVar17 || (~*(uint *)pGVar17 & 0x1fffffff) == 0)) {
        lVar19 = (long)(int)((int)uVar29 * pGVar17->Value);
        if (p->pPars->fProbTrans == 0) {
          iVar21 = 0;
          for (; 0 < (int)uVar29; uVar29 = uVar29 - 1) {
            iVar7 = Gia_WordCountOnes(puVar2[lVar19 + (uVar29 - 1)]);
            iVar21 = iVar21 + iVar7;
          }
        }
        else {
          iVar21 = 0;
          for (; 0 < (int)uVar29; uVar29 = uVar29 - 1) {
            iVar7 = Gia_WordCountOnes(puVar2[lVar19 + (uVar29 - 1)] & 0xffff ^
                                      puVar2[lVar19 + (uVar29 - 1)] >> 0x10);
            iVar21 = iVar21 + iVar7 * 2;
          }
        }
        p->pData1[lVar27] = p->pData1[lVar27] + iVar21;
      }
      lVar27 = lVar27 + 1;
    }
    uVar6 = pPars->nIters;
    if (iVar20 == uVar6 - 1) break;
    iVar13 = pPars->nRandPiFactor;
    pVVar18 = pGVar1->vCis;
    iVar21 = pGVar1->vCos->nSize;
    iVar7 = pVVar18->nSize;
    if (pPars->fProbTrans == 0) {
      iVar21 = iVar21 - iVar7;
      for (iVar28 = 0; iVar28 < iVar7 - pGVar1->nRegs; iVar28 = iVar28 + 1) {
        Gia_ManSwiSimInfoRandom(p,p->pDataSimCis + (long)iVar28 * (long)p->nWords,iVar13);
        pVVar18 = pGVar1->vCis;
        iVar7 = pVVar18->nSize;
        iVar21 = iVar21 + 1;
      }
      for (; iVar28 < iVar7; iVar28 = iVar28 + 1) {
        puVar2 = p->pDataSimCis;
        uVar6 = p->nWords;
        puVar3 = p->pDataSimCos;
        for (uVar23 = (ulong)uVar6; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
          puVar2[(long)(int)(uVar6 * iVar28) + (uVar23 - 1)] =
               puVar3[(long)(int)(uVar6 * iVar21) + (uVar23 - 1)];
        }
        iVar7 = pVVar18->nSize;
        iVar21 = iVar21 + 1;
      }
    }
    else {
      iVar21 = iVar21 - iVar7;
      for (iVar28 = 0; iVar28 < iVar7 - pGVar1->nRegs; iVar28 = iVar28 + 1) {
        puVar2 = p->pDataSimCis;
        uVar6 = p->nWords;
        uVar23 = (ulong)uVar6;
        if (iVar13 == -1) {
          uVar8 = Gia_ManRandom(0);
          uVar9 = Gia_ManRandom(0);
          uVar10 = Gia_ManRandom(0);
          uVar11 = Gia_ManRandom(0);
          uVar12 = Gia_ManRandom(0);
          uVar8 = uVar12 & uVar11 & uVar10 | uVar9 & uVar8;
        }
        else {
          if (iVar13 < 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                          ,0xca,
                          "void Gia_ManSwiSimInfoRandomShift(Gia_ManSwi_t *, unsigned int *, int)");
          }
          uVar8 = Gia_ManRandom(0);
          iVar7 = iVar13;
          while (bVar30 = iVar7 != 0, iVar7 = iVar7 + -1, bVar30) {
            uVar9 = Gia_ManRandom(0);
            uVar8 = uVar8 & uVar9;
          }
        }
        lVar27 = (long)(int)(uVar6 * iVar28);
        for (; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
          uVar6 = puVar2[lVar27 + (uVar23 - 1)];
          puVar2[lVar27 + (uVar23 - 1)] = (uVar6 ^ uVar8) & 0xffff | uVar6 << 0x10;
        }
        pVVar18 = pGVar1->vCis;
        iVar7 = pVVar18->nSize;
        iVar21 = iVar21 + 1;
      }
      for (; iVar28 < iVar7; iVar28 = iVar28 + 1) {
        puVar2 = p->pDataSimCis;
        uVar6 = p->nWords;
        puVar3 = p->pDataSimCos;
        for (uVar23 = (ulong)uVar6; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
          puVar2[(long)(int)(uVar6 * iVar28) + (uVar23 - 1)] =
               (uint)(ushort)puVar3[(long)(int)(uVar6 * iVar21) + (uVar23 - 1)] |
               puVar2[(long)(int)(uVar6 * iVar28) + (uVar23 - 1)] << 0x10;
        }
        iVar7 = pVVar18->nSize;
        iVar21 = iVar21 + 1;
      }
    }
  }
  if (pPars->fVerbose != 0) {
    iVar20 = 0x7647c5;
    printf("Simulated %d frames with %d words. ",(ulong)uVar6,(ulong)(uint)pPars->nWords);
    Abc_Print(iVar20,"%s =","Simulation time");
    aVar15 = Abc_Clock();
    Abc_Print(iVar20,"%9.2f sec\n",(double)(aVar15 - aVar14) / 1000000.0);
  }
  pVVar18 = Vec_IntStart(pAig->nObjs);
  piVar4 = pVVar18->pArray;
  if (pPars->fProbOne == 0) {
    if (pPars->fProbTrans == 0) {
      lVar27 = 0;
      while ((lVar27 < pAig->nObjs &&
             (pGVar17 = Gia_ManObj(pAig,(int)lVar27), pGVar17 != (Gia_Obj_t *)0x0))) {
        fVar31 = Gia_ManSwiComputeSwitching
                           (p->pData1[lVar27],(pPars->nIters - pPars->nPref) * pPars->nWords);
        piVar4[lVar27] = (int)fVar31;
        lVar27 = lVar27 + 1;
      }
    }
    else {
      lVar27 = 0;
      while ((lVar27 < pAig->nObjs &&
             (pGVar17 = Gia_ManObj(pAig,(int)lVar27), pGVar17 != (Gia_Obj_t *)0x0))) {
        piVar4[lVar27] =
             (int)((float)p->pData1[lVar27] /
                  (float)((pPars->nIters - pPars->nPref) * pPars->nWords * 0x20));
        lVar27 = lVar27 + 1;
      }
    }
  }
  else {
    lVar27 = 0;
    while ((lVar27 < pAig->nObjs &&
           (pGVar17 = Gia_ManObj(pAig,(int)lVar27), pGVar17 != (Gia_Obj_t *)0x0))) {
      piVar4[lVar27] =
           (int)((float)p->pData1[lVar27] /
                (float)((pPars->nIters - pPars->nPref) * pPars->nWords * 0x20));
      lVar27 = lVar27 + 1;
    }
    for (iVar20 = 0; iVar20 < pAig->vCos->nSize; iVar20 = iVar20 + 1) {
      iVar13 = Vec_IntEntry(pAig->vCos,iVar20);
      pGVar17 = Gia_ManObj(pAig,iVar13);
      if (pGVar17 == (Gia_Obj_t *)0x0) break;
      uVar5 = *(undefined8 *)pGVar17;
      iVar13 = Gia_ObjId(pAig,pGVar17 + -(ulong)((uint)uVar5 & 0x1fffffff));
      fVar31 = (float)piVar4[iVar13];
      if (((uint)uVar5 >> 0x1d & 1) != 0) {
        fVar31 = 1.0 - fVar31;
      }
      iVar13 = Gia_ObjId(pAig,pGVar17);
      piVar4[iVar13] = (int)fVar31;
    }
  }
  Gia_ManSwiDelete(p);
  return pVVar18;
}

Assistant:

Vec_Int_t * Gia_ManSwiSimulate( Gia_Man_t * pAig, Gia_ParSwi_t * pPars )
{
    Gia_ManSwi_t * p;
    Gia_Obj_t * pObj;
    Vec_Int_t * vSwitching;
    float * pSwitching;
    int i;
    abctime clk, clkTotal = Abc_Clock();
    if ( pPars->fProbOne && pPars->fProbTrans )
        printf( "Conflict of options: Can either compute probability of 1, or probability of switching by observing transitions.\n" );
    // create manager
    clk = Abc_Clock();
    p = Gia_ManSwiCreate( pAig, pPars );
    if ( pPars->fVerbose )
    {
        printf( "Obj = %8d (%8d). F = %6d. ", 
            pAig->nObjs, Gia_ManCiNum(pAig) + Gia_ManAndNum(pAig), p->pAig->nFront );
        printf( "AIG = %7.2f MB. F-mem = %7.2f MB. Other = %7.2f MB.  ", 
            12.0*Gia_ManObjNum(p->pAig)/(1<<20), 
            4.0*p->nWords*p->pAig->nFront/(1<<20), 
            4.0*p->nWords*(Gia_ManCiNum(p->pAig) + Gia_ManCoNum(p->pAig))/(1<<20) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    // perform simulation
    Gia_ManRandom( 1 );
    Gia_ManSwiSimInfoInit( p );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_ManSwiSimulateRound( p, i >= pPars->nPref );
        if ( i == pPars->nIters - 1 )
            break;
        if ( pPars->fProbTrans )
            Gia_ManSwiSimInfoTransferShift( p, pPars->nRandPiFactor );
        else
            Gia_ManSwiSimInfoTransfer( p, pPars->nRandPiFactor );
    }
    if ( pPars->fVerbose )
    {
        printf( "Simulated %d frames with %d words. ", pPars->nIters, pPars->nWords );
        ABC_PRT( "Simulation time", Abc_Clock() - clkTotal );
    }
    // derive the result
    vSwitching = Vec_IntStart( Gia_ManObjNum(pAig) );
    pSwitching = (float *)vSwitching->pArray;
    if ( pPars->fProbOne )
    {
        Gia_ManForEachObj( pAig, pObj, i )
            pSwitching[i] = Gia_ManSwiComputeProbOne( p->pData1[i], pPars->nWords*(pPars->nIters-pPars->nPref) );
        Gia_ManForEachCo( pAig, pObj, i )
        {
            if ( Gia_ObjFaninC0(pObj) )
                pSwitching[Gia_ObjId(pAig,pObj)] = (float)1.0-pSwitching[Gia_ObjId(pAig,Gia_ObjFanin0(pObj))];
            else
                pSwitching[Gia_ObjId(pAig,pObj)] = pSwitching[Gia_ObjId(pAig,Gia_ObjFanin0(pObj))];
        }
    }
    else if ( pPars->fProbTrans )
    {
        Gia_ManForEachObj( pAig, pObj, i )
            pSwitching[i] = Gia_ManSwiComputeProbOne( p->pData1[i], pPars->nWords*(pPars->nIters-pPars->nPref) );
    }
    else
    {
        Gia_ManForEachObj( pAig, pObj, i )
            pSwitching[i] = Gia_ManSwiComputeSwitching( p->pData1[i], pPars->nWords*(pPars->nIters-pPars->nPref) );
    }
/*
    printf( "PI: " );
    Gia_ManForEachPi( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );

    printf( "LO: " );
    Gia_ManForEachRo( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );

    printf( "PO: " );
    Gia_ManForEachPo( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );

    printf( "LI: " );
    Gia_ManForEachRi( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );
*/
    Gia_ManSwiDelete( p );
    return vSwitching;

}